

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID __thiscall ImGuiWindow::GetIDFromRectangle(ImGuiWindow *this,ImRect *r_abs)

{
  ImGuiID id_00;
  float *pfVar1;
  undefined1 auStack_2c [4];
  ImGuiID id;
  ImRect r_rel;
  ImGuiID seed;
  ImRect *r_abs_local;
  ImGuiWindow *this_local;
  
  unique0x10000064 = r_abs;
  pfVar1 = (float *)ImVector<unsigned_int>::back(&this->IDStack);
  r_rel.Max.x = *pfVar1;
  _auStack_2c = ImGui::WindowRectAbsToRel(this,stack0xffffffffffffffe8);
  id_00 = ImHashData(auStack_2c,0x10,(ImU32)r_rel.Max.x);
  ImGui::KeepAliveID(id_00);
  return id_00;
}

Assistant:

ImGuiID ImGuiWindow::GetIDFromRectangle(const ImRect& r_abs)
{
    ImGuiID seed = IDStack.back();
    ImRect r_rel = ImGui::WindowRectAbsToRel(this, r_abs);
    ImGuiID id = ImHashData(&r_rel, sizeof(r_rel), seed);
    ImGui::KeepAliveID(id);
    return id;
}